

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

SurfaceInteraction * __thiscall
pbrt::Cylinder::InteractionFromIntersection
          (Cylinder *this,QuadricIntersection *isect,Vector3f *wo,Float time)

{
  undefined1 auVar1 [16];
  long in_RDX;
  undefined8 *in_RSI;
  SurfaceInteraction *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  Point3fi *pi;
  SurfaceInteraction *this_00;
  undefined1 auVar17 [56];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  Vector3<float> VVar18;
  Vector3f woObject;
  bool flipNormal;
  Vector3f pError;
  Normal3f dndv;
  Normal3f dndu;
  Float invEGF2;
  Float g;
  Float f;
  Float e;
  Vector3f N;
  Float G;
  Float F;
  Float E;
  Vector3f d2Pdvv;
  Vector3f d2Pduv;
  Vector3f d2Pduu;
  Vector3f dpdv;
  Vector3f dpdu;
  Float v;
  Float u;
  Float phi;
  Point3f pHit;
  Vector3<float> *in_stack_fffffffffffffc08;
  Normal3<float> *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffc20;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  float s;
  Vector3<float> *v_00;
  Vector3<float> *w;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 uVar22;
  Vector3f *wo_00;
  undefined4 in_stack_fffffffffffffc80;
  SurfaceInteraction *dndu_00;
  Normal3f *dndv_00;
  Vector3<float> *in_stack_fffffffffffffd18;
  Transform *in_stack_fffffffffffffd20;
  Vector3f local_1ec;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  float local_1b8;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  SurfaceInteraction *si;
  undefined4 in_stack_fffffffffffffe7c;
  Tuple3<pbrt::Vector3,_float> local_b0;
  float local_a4;
  float local_a0;
  float local_9c;
  Vector3<float> local_98;
  Vector3<float> local_8c;
  Tuple3<pbrt::Vector3,_float> local_80 [2];
  Tuple3<pbrt::Vector3,_float> local_60;
  Vector3<float> local_54;
  Vector3<float> local_48;
  float local_3c;
  float local_38;
  float local_34;
  undefined8 local_30;
  float local_28;
  
  local_28 = *(float *)(in_RDX + 0xc);
  local_30 = *(undefined8 *)(in_RDX + 4);
  local_34 = *(float *)(in_RDX + 0x10);
  local_38 = local_34 / *(float *)(in_RSI + 4);
  local_3c = (local_28 - *(float *)(in_RSI + 3)) /
             (*(float *)((long)in_RSI + 0x1c) - *(float *)(in_RSI + 3));
  uVar19 = 0x80000000;
  uVar20 = 0x80000000;
  uVar21 = 0x80000000;
  s = -0.0;
  v_00 = &local_48;
  uVar22 = 0;
  dndu_00 = in_RDI;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffc10,
             (float)((ulong)in_stack_fffffffffffffc08 >> 0x20),SUB84(in_stack_fffffffffffffc08,0),
             0.0);
  w = &local_54;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffc10,
             (float)((ulong)in_stack_fffffffffffffc08 >> 0x20),SUB84(in_stack_fffffffffffffc08,0),
             0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffc10,
             (float)((ulong)in_stack_fffffffffffffc08 >> 0x20),SUB84(in_stack_fffffffffffffc08,0),
             0.0);
  auVar17 = (undefined1  [56])0x0;
  VVar18 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(uVar20,uVar19));
  local_80[0].z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar17;
  local_80[0]._0_8_ = vmovlpd_avx(auVar6._0_16_);
  local_60._0_8_ = local_80[0]._0_8_;
  local_60.z = local_80[0].z;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffc10,
             (float)((ulong)in_stack_fffffffffffffc08 >> 0x20),SUB84(in_stack_fffffffffffffc08,0),
             0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffc10,
             (float)((ulong)in_stack_fffffffffffffc08 >> 0x20),SUB84(in_stack_fffffffffffffc08,0),
             0.0);
  local_9c = Dot<float>(v_00,v_00);
  local_a0 = Dot<float>(v_00,w);
  local_a4 = Dot<float>(w,w);
  auVar17 = extraout_var;
  VVar18 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffc20,
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  auVar7._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar17;
  vmovlpd_avx(auVar7._0_16_);
  VVar18 = Normalize<float>((Vector3<float> *)CONCAT44(s,uVar21));
  local_b0.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar17;
  local_b0._0_8_ = vmovlpd_avx(auVar8._0_16_);
  fVar2 = Dot<float>((Vector3<float> *)&local_b0,(Vector3<float> *)&local_60);
  fVar3 = Dot<float>((Vector3<float> *)&local_b0,&local_8c);
  fVar4 = Dot<float>((Vector3<float> *)&local_b0,&local_98);
  vfmsub213ss_fma(ZEXT416((uint)local_a4),ZEXT416((uint)local_9c),
                  ZEXT416((uint)(local_a0 * local_a0)));
  vfmsub213ss_fma(ZEXT416((uint)local_a0),ZEXT416((uint)fVar3),ZEXT416((uint)(fVar2 * local_a4)));
  auVar17 = (undefined1  [56])0x0;
  VVar18 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(uVar20,uVar19));
  auVar9._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar17;
  vmovlpd_avx(auVar9._0_16_);
  vfmsub213ss_fma(ZEXT416((uint)local_a0),ZEXT416((uint)fVar2),ZEXT416((uint)(fVar3 * local_9c)));
  auVar17 = (undefined1  [56])0x0;
  VVar18 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(uVar20,uVar19));
  auVar10._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar17;
  vmovlpd_avx(auVar10._0_16_);
  VVar18 = Tuple3<pbrt::Vector3,float>::operator+
                     (in_stack_fffffffffffffc20,
                      (Vector3<float> *)
                      CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  auVar11._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar17;
  vmovlpd_avx(auVar11._0_16_);
  Normal3<float>::Normal3<float>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  vfmsub213ss_fma(ZEXT416((uint)local_a0),ZEXT416((uint)fVar4),ZEXT416((uint)(fVar3 * local_a4)));
  auVar17 = (undefined1  [56])0x0;
  VVar18 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(uVar20,uVar19));
  fVar2 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar17;
  si = (SurfaceInteraction *)vmovlpd_avx(auVar12._0_16_);
  vfmsub213ss_fma(ZEXT416((uint)local_a0),ZEXT416((uint)fVar3),ZEXT416((uint)(fVar4 * local_9c)));
  auVar17 = (undefined1  [56])0x0;
  VVar18 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(uVar20,uVar19));
  local_1a8 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar17;
  local_1b0 = vmovlpd_avx(auVar13._0_16_);
  local_1a0 = local_1b0;
  local_198 = local_1a8;
  VVar18 = Tuple3<pbrt::Vector3,float>::operator+
                     (in_stack_fffffffffffffc20,
                      (Vector3<float> *)
                      CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  local_1b8 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar17;
  local_1c0 = vmovlpd_avx(auVar14._0_16_);
  Normal3<float>::Normal3<float>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  auVar14._0_8_ = pbrt::gamma(auVar14._0_8_);
  uVar5 = SUB84(auVar14._0_8_,0);
  this_00 = (SurfaceInteraction *)0x0;
  wo_00 = &local_1ec;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffc10,
             (float)((ulong)in_stack_fffffffffffffc08 >> 0x20),SUB84(in_stack_fffffffffffffc08,0),
             0.0);
  VVar18 = Abs<pbrt::Vector3,float>(in_stack_fffffffffffffc20);
  local_1d8 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  pi = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17 = (undefined1  [56])0x0;
  auVar1._8_8_ = this_00;
  auVar1._0_8_ = pi;
  local_1e0 = vmovlpd_avx(auVar1);
  VVar18 = pbrt::operator*(s,(Tuple3<pbrt::Vector3,_float> *)CONCAT44(uVar20,uVar19));
  local_1c8 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar17;
  local_1d0 = vmovlpd_avx(auVar15._0_16_);
  VVar18 = Transform::operator()(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  auVar16._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar17;
  vmovlpd_avx(auVar16._0_16_);
  dndv_00 = (Normal3f *)*in_RSI;
  Point3fi::Point3fi((Point3fi *)CONCAT44(s,uVar21),(Point3f *)CONCAT44(uVar20,uVar19),
                     (Vector3f *)in_stack_fffffffffffffc20);
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffc10,
             (float)((ulong)in_stack_fffffffffffffc08 >> 0x20),SUB84(in_stack_fffffffffffffc08,0));
  SurfaceInteraction::SurfaceInteraction
            (this_00,pi,(Point2f *)CONCAT44(uVar5,in_stack_fffffffffffffc80),wo_00,
             (Vector3f *)CONCAT44(uVar22,in_stack_fffffffffffffc70),w,(Normal3f *)dndu_00,dndv_00,
             (Float)((ulong)v_00 >> 0x20),SUB81((ulong)v_00 >> 0x18,0));
  Transform::operator()((Transform *)CONCAT44(in_stack_fffffffffffffe7c,fVar2),si);
  return in_RDI;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of cylinder hit
        Float u = phi / phiMax;
        Float v = (pHit.z - zMin) / (zMax - zMin);
        // Compute cylinder $\dpdu$ and $\dpdv$
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv(0, 0, zMax - zMin);

        // Compute cylinder $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv(0, 0, 0), d2Pdvv(0, 0, 0);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float invEGF2 = 1 / (E * G - F * F);
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for cylinder intersection
        Vector3f pError = gamma(3) * Abs(Vector3f(pHit.x, pHit.y, 0));

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }